

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomResourceIcon::write(DomResourceIcon *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomResourcePixmap *pDVar2;
  char cVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_48.d = (Data *)0x0;
    local_60.d = (Data *)0x0;
    local_60.ptr = (char16_t *)0x0;
    local_60.size = 0;
    local_48.ptr = L"resourceicon";
    local_48.size = 0xc;
  }
  else {
    QString::toLower_helper((QString *)&local_48);
  }
  QVar8.m_size = (size_t)local_48.ptr;
  QVar8.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (this->m_has_attr_theme == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"theme",5);
    QVar6.field_0.m_data = (void *)(local_48.size | 0x8000000000000000);
    local_78.d = (this->m_attr_theme).d.d;
    __n = (size_t)(this->m_attr_theme).d.ptr;
    local_78.size = (this->m_attr_theme).d.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar6.m_size = __n;
    QVar9.m_size = (size_t)local_48.ptr;
    QVar9.field_0.m_data = aVar5.m_data;
    local_78.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar9,QVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (this->m_has_attr_resource == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"resource",8);
    QVar7.field_0.m_data = (void *)(local_48.size | 0x8000000000000000);
    local_78.d = (this->m_attr_resource).d.d;
    __n = (size_t)(this->m_attr_resource).d.ptr;
    local_78.size = (this->m_attr_resource).d.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_size = __n;
    QVar10.m_size = (size_t)local_48.ptr;
    QVar10.field_0.m_data = aVar5.m_data;
    local_78.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar10,QVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  uVar4 = this->m_children;
  if ((uVar4 & 1) != 0) {
    pDVar2 = this->m_normalOff;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"normaloff",9);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 2) != 0) {
    pDVar2 = this->m_normalOn;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"normalon",8);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 4) != 0) {
    pDVar2 = this->m_disabledOff;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"disabledoff",0xb);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 8) != 0) {
    pDVar2 = this->m_disabledOn;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"disabledon",10);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 0x10) != 0) {
    pDVar2 = this->m_activeOff;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"activeoff",9);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 0x20) != 0) {
    pDVar2 = this->m_activeOn;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"activeon",8);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar4 = this->m_children;
  }
  cVar3 = (char)uVar4;
  if ((uVar4 & 0x40) != 0) {
    pDVar2 = this->m_selectedOff;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"selectedoff",0xb);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    cVar3 = (char)this->m_children;
  }
  if (cVar3 < '\0') {
    pDVar2 = this->m_selectedOn;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_48,L"selectedon",10);
    DomResourcePixmap::write(pDVar2,__fd,&local_48,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if ((this->m_text).d.size != 0) {
    QVar11.m_size = (size_t)(this->m_text).d.ptr;
    QVar11.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeCharacters(QVar11);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomResourceIcon::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resourceicon") : tagName.toLower());

    if (hasAttributeTheme())
        writer.writeAttribute(u"theme"_s, attributeTheme());

    if (hasAttributeResource())
        writer.writeAttribute(u"resource"_s, attributeResource());

    if (m_children & NormalOff)
        m_normalOff->write(writer, u"normaloff"_s);

    if (m_children & NormalOn)
        m_normalOn->write(writer, u"normalon"_s);

    if (m_children & DisabledOff)
        m_disabledOff->write(writer, u"disabledoff"_s);

    if (m_children & DisabledOn)
        m_disabledOn->write(writer, u"disabledon"_s);

    if (m_children & ActiveOff)
        m_activeOff->write(writer, u"activeoff"_s);

    if (m_children & ActiveOn)
        m_activeOn->write(writer, u"activeon"_s);

    if (m_children & SelectedOff)
        m_selectedOff->write(writer, u"selectedoff"_s);

    if (m_children & SelectedOn)
        m_selectedOn->write(writer, u"selectedon"_s);

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}